

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

QItemViewPaintPairs * __thiscall
QTreeViewPrivate::draggablePaintPairs
          (QItemViewPaintPairs *__return_storage_ptr__,QTreeViewPrivate *this,
          QModelIndexList *indexes,QRect *r)

{
  int row;
  Data *pDVar1;
  QTreeView *this_00;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  QModelIndex *idx;
  QModelIndex *args;
  long lVar4;
  long in_FS_OFFSET;
  QModelIndex local_70;
  QList<QModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->spanningIndexes).q_hash.d;
  if ((pDVar1 == (Data *)0x0) || (pDVar1->size == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_005a0b4b;
    QAbstractItemViewPrivate::draggablePaintPairs
              (__return_storage_ptr__,&this->super_QAbstractItemViewPrivate,indexes,r);
  }
  else {
    this_00 = *(QTreeView **)
               &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (QModelIndex *)0x0;
    local_58.d.size = 0;
    lVar4 = (indexes->d).size;
    if (lVar4 != 0) {
      args = (indexes->d).ptr;
      lVar4 = lVar4 * 0x18;
      do {
        if (args->c < 1) {
LAB_005a0aab:
          QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                    ((QMovableArrayOps<QModelIndex> *)&local_58,local_58.d.size,args);
          QList<QModelIndex>::end(&local_58);
        }
        else {
          row = args->r;
          pQVar2 = (args->m).ptr;
          if (pQVar2 == (QAbstractItemModel *)0x0) {
            local_70.r = -1;
            local_70.c = -1;
            local_70.i = 0;
            local_70.m.ptr = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)pQVar2 + 0x68))(&local_70,pQVar2,args);
          }
          bVar3 = QTreeView::isFirstColumnSpanned(this_00,row,&local_70);
          if (!bVar3) goto LAB_005a0aab;
        }
        args = args + 1;
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != 0);
    }
    QAbstractItemViewPrivate::draggablePaintPairs
              (__return_storage_ptr__,&this->super_QAbstractItemViewPrivate,&local_58,r);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,0x18,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_005a0b4b:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QItemViewPaintPairs QTreeViewPrivate::draggablePaintPairs(const QModelIndexList &indexes, QRect *r) const
{
    Q_ASSERT(r);
    Q_Q(const QTreeView);
    if (spanningIndexes.isEmpty())
        return QAbstractItemViewPrivate::draggablePaintPairs(indexes, r);
    QModelIndexList list;
    for (const QModelIndex &idx : indexes) {
        if (idx.column() > 0 && q->isFirstColumnSpanned(idx.row(), idx.parent()))
            continue;
        list << idx;
    }
    return QAbstractItemViewPrivate::draggablePaintPairs(list, r);
}